

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# effects.h
# Opt level: O0

void __thiscall
wasm::EffectAnalyzer::InternalAnalyzer::visitArrayFill(InternalAnalyzer *this,ArrayFill *curr)

{
  bool bVar1;
  ArrayFill *curr_local;
  InternalAnalyzer *this_local;
  
  bVar1 = wasm::Type::isNull(&curr->ref->type);
  if (bVar1) {
    this->parent->trap = true;
  }
  else {
    this->parent->writesArray = true;
    this->parent->implicitTrap = true;
  }
  return;
}

Assistant:

void visitArrayFill(ArrayFill* curr) {
      if (curr->ref->type.isNull()) {
        parent.trap = true;
        return;
      }
      parent.writesArray = true;
      // Traps when the destination is null or when out of bounds.
      parent.implicitTrap = true;
    }